

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O2

value value_from_map(value v,value *tuples,size_t size)

{
  size_t sVar1;
  value pvVar2;
  ulong bytes;
  
  if (size != 0 && (tuples != (value *)0x0 && v != (value)0x0)) {
    sVar1 = value_size(v);
    bytes = size << 3;
    if (sVar1 <= size << 3) {
      bytes = sVar1;
    }
    pvVar2 = value_from(v,tuples,bytes);
    return pvVar2;
  }
  return v;
}

Assistant:

value value_from_map(value v, const value *tuples, size_t size)
{
	if (v != NULL && tuples != NULL && size > 0)
	{
		size_t current_size = value_size(v);

		size_t bytes = sizeof(const value) * size;

		return value_from(v, tuples, (bytes <= current_size) ? bytes : current_size);
	}

	return v;
}